

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O0

void __thiscall TracerouteRunner::TracerouteRunner(TracerouteRunner *this,string *net_addr)

{
  string *net_addr_local;
  TracerouteRunner *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->results);
  std::mutex::mutex(&this->mutex_results);
  std::__cxx11::string::string((string *)&this->network_address);
  this->output_position = 0;
  this->read_complete = false;
  std::__cxx11::string::operator=((string *)&this->network_address,(string *)net_addr);
  return;
}

Assistant:

TracerouteRunner::TracerouteRunner(const std::string &net_addr) {
	this->network_address = net_addr;
}